

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexCompareVerifier.cpp
# Opt level: O2

bool tcu::isNearestCompareResultValid
               (ConstPixelBufferAccess *level,Sampler *sampler,TexComparePrecision *prec,Vec2 *coord
               ,int coordZ,float cmpReference,float result)

{
  bool isFixedPoint;
  bool bVar1;
  CmpResultSet resultSet;
  int i_00;
  int j;
  int i;
  int c;
  int c_00;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  Vec2 vBounds;
  Vec2 uBounds;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  
  isFixedPoint = isFixedPointDepthTextureFormat(&level->m_format);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&local_38,sampler->normalizedCoords,(level->m_size).m_data[0],
             coord->m_data[0],(prec->coordBits).m_data[0],(prec->uvwBits).m_data[0]);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&local_40,sampler->normalizedCoords,(level->m_size).m_data[1],
             coord->m_data[1],(prec->coordBits).m_data[1],(prec->uvwBits).m_data[1]);
  fVar2 = floorf(local_38);
  fVar3 = floorf(local_34);
  fVar4 = floorf(local_40);
  fVar5 = floorf(local_3c);
  for (c_00 = (int)fVar4; c = (int)fVar2, c_00 <= (int)fVar5; c_00 = c_00 + 1) {
    while (c <= (int)fVar3) {
      i_00 = TexVerifierUtil::wrap(sampler->wrapS,c,(level->m_size).m_data[0]);
      j = TexVerifierUtil::wrap(sampler->wrapT,c_00,(level->m_size).m_data[1]);
      fVar4 = lookupDepth(level,sampler,i_00,j,coordZ);
      resultSet = execCompare(sampler->compare,fVar4,cmpReference,prec->referenceBits,isFixedPoint);
      bVar1 = isResultInSet(resultSet,result,prec->resultBits);
      c = c + 1;
      if (bVar1) goto LAB_0097cf94;
    }
  }
LAB_0097cf94:
  return c_00 <= (int)fVar5;
}

Assistant:

static bool isNearestCompareResultValid (const ConstPixelBufferAccess&		level,
										 const Sampler&						sampler,
										 const TexComparePrecision&			prec,
										 const Vec2&						coord,
										 const int							coordZ,
										 const float						cmpReference,
										 const float						result)
{
	const bool	isFixedPointDepth	= isFixedPointDepthTextureFormat(level.getFormat());
	const Vec2	uBounds				= computeNonNormalizedCoordBounds(sampler.normalizedCoords, level.getWidth(),	coord.x(), prec.coordBits.x(), prec.uvwBits.x());
	const Vec2	vBounds				= computeNonNormalizedCoordBounds(sampler.normalizedCoords, level.getHeight(),	coord.y(), prec.coordBits.y(), prec.uvwBits.y());

	// Integer coordinates - without wrap mode
	const int	minI		= deFloorFloatToInt32(uBounds.x());
	const int	maxI		= deFloorFloatToInt32(uBounds.y());
	const int	minJ		= deFloorFloatToInt32(vBounds.x());
	const int	maxJ		= deFloorFloatToInt32(vBounds.y());

	for (int j = minJ; j <= maxJ; j++)
	{
		for (int i = minI; i <= maxI; i++)
		{
			const int			x		= wrap(sampler.wrapS, i, level.getWidth());
			const int			y		= wrap(sampler.wrapT, j, level.getHeight());
			const float			depth	= lookupDepth(level, sampler, x, y, coordZ);
			const CmpResultSet	resSet	= execCompare(sampler.compare, depth, cmpReference, prec.referenceBits, isFixedPointDepth);

			if (isResultInSet(resSet, result, prec.resultBits))
				return true;
		}
	}

	return false;
}